

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.h
# Opt level: O3

void __thiscall ArgParser::ArgParser(ArgParser *this,string *preInfo,string *postInfo)

{
  pointer pcVar1;
  
  (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_preInfo)._M_dataplus._M_p = (pointer)&(this->m_preInfo).field_2;
  pcVar1 = (preInfo->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_preInfo,pcVar1,pcVar1 + preInfo->_M_string_length);
  (this->m_postInfo)._M_dataplus._M_p = (pointer)&(this->m_postInfo).field_2;
  pcVar1 = (postInfo->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_postInfo,pcVar1,pcVar1 + postInfo->_M_string_length);
  return;
}

Assistant:

ArgParser(std::string preInfo = "", std::string postInfo = "")
        : m_preInfo(preInfo), m_postInfo(postInfo) {}